

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall sglr::rc::TextureCube::TextureCube(TextureCube *this,deUint32 name)

{
  TextureLevelArray *local_30;
  deUint32 name_local;
  TextureCube *this_local;
  
  rc::Texture::Texture(&this->super_Texture,name,TYPE_CUBE_MAP);
  (this->super_Texture).super_NamedObject._vptr_NamedObject =
       (_func_int **)&PTR__TextureCube_032d88d8;
  local_30 = this->m_levels;
  do {
    TextureLevelArray::TextureLevelArray(local_30);
    local_30 = local_30 + 1;
  } while (local_30 != (TextureLevelArray *)&this->m_view);
  tcu::TextureCubeView::TextureCubeView(&this->m_view);
  return;
}

Assistant:

TextureCube::TextureCube (deUint32 name)
	: Texture(name, TYPE_CUBE_MAP)
{
}